

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void pack_table(void)

{
  int iVar1;
  Yshort local_10;
  int state;
  int place;
  int i;
  
  base = (Yshort *)allocate(nvectors << 2);
  pos = (Yshort *)allocate(nentries << 2);
  maxtable = 1000;
  table = (Yshort *)allocate(4000);
  check = (Yshort *)allocate(maxtable << 2);
  lowzero = 0;
  high = 0;
  for (state = 0; state < maxtable; state = state + 1) {
    check[state] = -1;
  }
  for (state = 0; state < nentries; state = state + 1) {
    iVar1 = matching_vector(state);
    if (iVar1 < 0) {
      local_10 = pack_vector(state);
    }
    else {
      local_10 = base[iVar1];
    }
    pos[state] = local_10;
    base[order[state]] = local_10;
  }
  for (state = 0; state < nvectors; state = state + 1) {
    if (froms[state] != (Yshort *)0x0) {
      free(froms[state]);
    }
    if (tos[state] != (Yshort *)0x0) {
      free(tos[state]);
    }
  }
  free(froms);
  free(tos);
  free(tally);
  free(width);
  free(pos);
  return;
}

Assistant:

void pack_table()
{
    register int i;
    register int place;
    register int state;

    base = NEW2(nvectors, Yshort);
    pos = NEW2(nentries, Yshort);

    maxtable = 1000;
    table = NEW2(maxtable, Yshort);
    check = NEW2(maxtable, Yshort);

    lowzero = 0;
    high = 0;

    for (i = 0; i < maxtable; i++)
	check[i] = -1;

    for (i = 0; i < nentries; i++)
    {
	state = matching_vector(i);

	if (state < 0)
	    place = pack_vector(i);
	else
	    place = base[state];

	pos[i] = place;
	base[order[i]] = place;
    }

    for (i = 0; i < nvectors; i++)
    {
	if (froms[i])
	    FREE(froms[i]);
	if (tos[i])
	    FREE(tos[i]);
    }

    FREE(froms);
    FREE(tos);
    FREE(tally);
    FREE(width);
    FREE(pos);
}